

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# AMReX_MLMG.cpp
# Opt level: O1

void __thiscall amrex::MLMG::makeSolvable(MLMG *this,int amrlev,int mglev,Any *mf)

{
  ostringstream *this_00;
  uint uVar1;
  ulong uVar2;
  void *local_1e0;
  long local_1d8;
  long local_1d0;
  MLMG *local_1c8;
  Any *local_1c0;
  Print local_1b8;
  
  local_1c0 = mf;
  (*this->linop->_vptr_MLLinOp[0x1b])(&local_1e0,this->linop,(ulong)(uint)amrlev,(ulong)(uint)mglev)
  ;
  local_1c8 = this;
  if ((3 < this->verbose) &&
     (uVar1 = (uint)((ulong)(local_1d8 - (long)local_1e0) >> 3), 0 < (int)uVar1)) {
    this_00 = &local_1b8.ss;
    uVar2 = 0;
    do {
      local_1b8.os = OutStream();
      local_1b8.rank = *(int *)(DAT_00756620 + -0x30);
      local_1b8.comm = *(MPI_Comm *)(DAT_00756620 + -0x48);
      std::__cxx11::ostringstream::ostringstream((ostringstream *)this_00);
      *(undefined8 *)(&local_1b8.field_0x18 + *(long *)(local_1b8._16_8_ + -0x18)) =
           *(undefined8 *)(local_1b8.os + *(long *)(*(long *)local_1b8.os + -0x18) + 8);
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00,"MLMG: Subtracting ",0x12);
      std::ostream::_M_insert<double>(*(double *)((long)local_1e0 + uVar2 * 8));
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)this_00," from mf component c = ",0x17);
      std::ostream::operator<<(this_00,(int)uVar2);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00," on level (",0xb);
      std::ostream::operator<<(this_00,amrlev);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,", ",2);
      std::ostream::operator<<(this_00,mglev);
      std::__ostream_insert<char,std::char_traits<char>>((ostream *)this_00,")\n",2);
      Print::~Print(&local_1b8);
      uVar2 = uVar2 + 1;
    } while ((uVar1 & 0x7fffffff) != uVar2);
  }
  (*local_1c8->linop->_vptr_MLLinOp[0x1c])
            (local_1c8->linop,(ulong)(uint)amrlev,(ulong)(uint)mglev,local_1c0,&local_1e0);
  if (local_1e0 != (void *)0x0) {
    operator_delete(local_1e0,local_1d0 - (long)local_1e0);
  }
  return;
}

Assistant:

void
MLMG::makeSolvable (int amrlev, int mglev, Any& mf)
{
    auto const& offset = linop.getSolvabilityOffset(amrlev, mglev, mf);
    if (verbose >= 4) {
        const int ncomp = offset.size();
        for (int c = 0; c < ncomp; ++c) {
            amrex::Print() << "MLMG: Subtracting " << offset[c]
                           << " from mf component c = " << c
                           << " on level (" << amrlev << ", " << mglev << ")\n";
        }
    }
    linop.fixSolvabilityByOffset(amrlev, mglev, mf, offset);
}